

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O0

void uv_os_free_group(uv_group_t *grp)

{
  uv_group_t *grp_local;
  
  if (grp != (uv_group_t *)0x0) {
    uv__free(grp->members);
    grp->members = (char **)0x0;
    grp->groupname = (char *)0x0;
  }
  return;
}

Assistant:

void uv_os_free_group(uv_group_t *grp) {
  if (grp == NULL)
    return;

  /* The memory for is allocated in a single uv__malloc() call. The base of the
   * pointer is stored in grp->members, so that is the only field that needs to
   * be freed.
   */
  uv__free(grp->members);
  grp->members = NULL;
  grp->groupname = NULL;
}